

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateProfiledNewScObjArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length,LabelInstr *labelDone,bool isNoArgs)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  uint sourceContextId;
  uint functionId;
  uint32 uVar4;
  uint32 uVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  ProfiledInstr *pPVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  IntConstOpnd *pIVar11;
  AddrOpnd *pAVar12;
  uint local_80;
  uint i_2;
  uint offsetStart_1;
  uint i_1;
  uint offsetStart;
  uint i;
  ProfileId profileId;
  RegOpnd *headOpnd;
  RegOpnd *dstOpnd;
  bool isZeroed;
  LabelInstr *pLStack_50;
  uint32 size;
  LabelInstr *helperLabel;
  Func *func;
  bool isNoArgs_local;
  intptr_t iStack_38;
  uint32 length_local;
  intptr_t weakFuncRef_local;
  intptr_t arrayInfoAddr_local;
  ArrayCallSiteInfo *arrayInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  func._3_1_ = isNoArgs;
  func._4_4_ = length;
  iStack_38 = weakFuncRef;
  weakFuncRef_local = arrayInfoAddr;
  arrayInfoAddr_local = (intptr_t)arrayInfo;
  arrayInfo_local = (ArrayCallSiteInfo *)instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    helperLabel = (LabelInstr *)this->m_func;
    pLStack_50 = IR::LabelInstr::New(Label,(Func *)helperLabel,true);
    dstOpnd._4_4_ = func._4_4_;
    dstOpnd._3_1_ = 0;
    pOVar6 = IR::Instr::GetDst((Instr *)arrayInfo_local);
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
    pPVar8 = IR::Instr::AsProfiledInstr((Instr *)arrayInfo_local);
    uVar3 = (pPVar8->u).field_3.fldInfoData.f1;
    if ((arrayInfoAddr_local == 0) ||
       (bVar2 = Js::ArrayCallSiteInfo::IsNativeIntArray((ArrayCallSiteInfo *)arrayInfoAddr_local),
       !bVar2)) {
      if ((arrayInfoAddr_local == 0) ||
         (bVar2 = Js::ArrayCallSiteInfo::IsNativeFloatArray
                            ((ArrayCallSiteInfo *)arrayInfoAddr_local), !bVar2)) {
        pRVar7 = GenerateArrayObjectsAlloc<Js::JavascriptArray>
                           (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                            (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3),
                            (bool)(func._3_1_ & 1));
        for (local_80 = 0; local_80 < dstOpnd._4_4_; local_80 = local_80 + 1) {
          pOVar6 = GetMissingItemOpndForAssignment(TyVar,this->m_func);
          GenerateMemInit(this,pRVar7,local_80 * 8 + 0x18,pOVar6,(Instr *)arrayInfo_local,
                          (bool)(dstOpnd._3_1_ & 1));
        }
      }
      else {
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                  (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                   weakFuncRef_local,pLStack_50);
        uVar4 = Js::JavascriptArray::GetOffsetOfArrayFlags();
        uVar5 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
        if ((ulong)uVar4 + 2 != (ulong)uVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0xfd8,
                             "(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex())"
                             ,
                             "Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex()"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pRVar10 = GenerateArrayObjectsAlloc<Js::JavascriptNativeFloatArray>
                            (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                             (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3),
                             (bool)(func._3_1_ & 1));
        uVar4 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
        pIVar11 = IR::IntConstOpnd::New((ulong)uVar3,TyUint16,(Func *)helperLabel,true);
        GenerateMemInit(this,pRVar7,uVar4,&pIVar11->super_Opnd,(Instr *)arrayInfo_local,
                        (bool)(dstOpnd._3_1_ & 1));
        uVar4 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
        pAVar12 = IR::AddrOpnd::New(iStack_38,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                    false,(Var)0x0);
        GenerateMemInit(this,pRVar7,uVar4,&pAVar12->super_Opnd,(Instr *)arrayInfo_local,
                        (bool)(dstOpnd._3_1_ & 1));
        for (i_2 = 0; i_2 < dstOpnd._4_4_; i_2 = i_2 + 1) {
          pOVar6 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
          GenerateMemInit(this,pRVar10,i_2 * 8 + 0x18,pOVar6,(Instr *)arrayInfo_local,
                          (bool)(dstOpnd._3_1_ & 1));
        }
      }
    }
    else {
      GenerateArrayInfoIsNativeIntArrayTest
                (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                 weakFuncRef_local,pLStack_50);
      uVar4 = Js::JavascriptArray::GetOffsetOfArrayFlags();
      uVar5 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
      if ((ulong)uVar4 + 2 != (ulong)uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0xfca,
                           "(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex())"
                           ,
                           "Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pRVar10 = GenerateArrayObjectsAlloc<Js::JavascriptNativeIntArray>
                          (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                           (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3),
                           (bool)(func._3_1_ & 1));
      uVar4 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
      pIVar11 = IR::IntConstOpnd::New((ulong)uVar3,TyUint16,(Func *)helperLabel,true);
      GenerateMemInit(this,pRVar7,uVar4,&pIVar11->super_Opnd,(Instr *)arrayInfo_local,
                      (bool)(dstOpnd._3_1_ & 1));
      uVar4 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
      pAVar12 = IR::AddrOpnd::New(iStack_38,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                  false,(Var)0x0);
      GenerateMemInit(this,pRVar7,uVar4,&pAVar12->super_Opnd,(Instr *)arrayInfo_local,
                      (bool)(dstOpnd._3_1_ & 1));
      for (i_1 = 0; i_1 < dstOpnd._4_4_; i_1 = i_1 + 1) {
        GenerateMemInit(this,pRVar10,i_1 * 4 + 0x18,-0x7fffe,(Instr *)arrayInfo_local,
                        (bool)(dstOpnd._3_1_ & 1));
      }
    }
    InsertBranch(Br,labelDone,(Instr *)arrayInfo_local);
    IR::Instr::InsertBefore((Instr *)arrayInfo_local,&pLStack_50->super_Instr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::GenerateProfiledNewScObjArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length, IR::LabelInstr* labelDone, bool isNoArgs)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed = false;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
    if (arrayInfo && arrayInfo->IsNativeIntArray())
    {
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                            Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
    {
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);

        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);
        for (uint i = 0; i < size; i++)
        {
             GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    InsertBranch(Js::OpCode::Br, labelDone, instr);
    instr->InsertBefore(helperLabel);
    return true;
}